

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_together.c
# Opt level: O1

void runtests(int n_workers)

{
  int i;
  uint uVar1;
  Task local_60;
  
  lace_start(n_workers,0);
  puts("Newframe:");
  local_60.f = test_something_WRAP;
  local_60.thief = (_Worker *)0x1;
  lace_run_newframe(&local_60);
  puts("Together:");
  local_60.f = test_something_WRAP;
  local_60.thief = (_Worker *)0x1;
  lace_run_together(&local_60);
  lace_suspend();
  lace_resume();
  puts("Running (10x):");
  uVar1 = 0;
  do {
    printf("%d: ",(ulong)uVar1);
    local_60.f = test_something_WRAP;
    local_60.thief = (_Worker *)0x1;
    lace_run_task(&local_60);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 5);
  puts("Recursive test");
  local_60.f = _main_WRAP;
  local_60.thief = (_Worker *)0x1;
  local_60.d[0] = '\0';
  local_60.d[1] = '\0';
  local_60.d[2] = '\0';
  local_60.d[3] = '\0';
  local_60.d[4] = '\0';
  local_60.d[5] = '\0';
  local_60.d[6] = '\0';
  local_60.d[7] = '\0';
  lace_run_task(&local_60);
  lace_stop();
  return;
}

Assistant:

void
runtests(int n_workers)
{
    // Initialize the Lace framework for <n_workers> workers.
    lace_start(n_workers, 0);

    printf("Newframe:\n");
    NEWFRAME(test_something);

    printf("Together:\n");
    TOGETHER(test_something);

    lace_suspend();
    lace_resume();

    // Spawn and start all worker pthreads; suspends current thread until done.
    printf("Running (10x):\n");
    for (int i=0; i<5; i++) {
        printf("%d: ", i);
        RUN(test_something);
    }

    // Spawn and start all worker pthreads; suspends current thread until done.
    printf("Recursive test\n");
    RUN(_main, NULL);

    // The lace_startup command also exits Lace after _main is completed.
    lace_stop();
}